

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O3

void __thiscall QTlsPrivate::TlsKeyOpenSSL::clear(TlsKeyOpenSSL *this,bool deep)

{
  KeyAlgorithm KVar1;
  EVP_PKEY *a;
  
  (this->super_TlsKeyBase).keyIsNull = true;
  KVar1 = (this->super_TlsKeyBase).keyAlgorithm;
  if (KVar1 == Rsa) {
    if ((this->field_0).rsa != (RSA *)0x0) {
      KVar1 = Rsa;
      if (deep) {
        q_RSA_free((this->field_0).rsa);
        KVar1 = (this->super_TlsKeyBase).keyAlgorithm;
      }
      (this->field_0).opaque = (EVP_PKEY *)0x0;
      goto LAB_001238b5;
    }
LAB_00123931:
    a = (this->field_0).opaque;
    if (a == (EVP_PKEY *)0x0) {
      return;
    }
  }
  else {
LAB_001238b5:
    if (KVar1 == Dsa) {
      if ((this->field_0).dsa == (DSA *)0x0) goto LAB_00123931;
      KVar1 = Dsa;
      if (deep) {
        q_DSA_free((this->field_0).dsa);
        KVar1 = (this->super_TlsKeyBase).keyAlgorithm;
      }
      (this->field_0).opaque = (EVP_PKEY *)0x0;
    }
    if (KVar1 == Dh) {
      if ((this->field_0).dh == (DH *)0x0) goto LAB_00123931;
      KVar1 = Dh;
      if (deep) {
        q_DH_free((this->field_0).dh);
        KVar1 = (this->super_TlsKeyBase).keyAlgorithm;
      }
      (this->field_0).opaque = (EVP_PKEY *)0x0;
    }
    if (KVar1 == Ec) {
      if ((this->field_0).ec == (EC_KEY *)0x0) goto LAB_00123931;
      KVar1 = Ec;
      if (deep) {
        q_EC_KEY_free((this->field_0).ec);
        KVar1 = (this->super_TlsKeyBase).keyAlgorithm;
      }
      (this->field_0).opaque = (EVP_PKEY *)0x0;
    }
    if (KVar1 != Opaque) goto LAB_00123931;
    a = (this->field_0).opaque;
    if (a == (EVP_PKEY *)0x0) {
      return;
    }
    if (!deep) goto LAB_0012393e;
  }
  q_EVP_PKEY_free(a);
LAB_0012393e:
  (this->field_0).opaque = (EVP_PKEY *)0x0;
  return;
}

Assistant:

void TlsKeyOpenSSL::clear(bool deep)
{
    keyIsNull = true;

#ifndef OPENSSL_NO_DEPRECATED_3_0
    if (algorithm() == QSsl::Rsa && rsa) {
        if (deep)
            q_RSA_free(rsa);
        rsa = nullptr;
    }
    if (algorithm() == QSsl::Dsa && dsa) {
        if (deep)
            q_DSA_free(dsa);
        dsa = nullptr;
    }
    if (algorithm() == QSsl::Dh && dh) {
        if (deep)
            q_DH_free(dh);
        dh = nullptr;
    }
#ifndef OPENSSL_NO_EC
    if (algorithm() == QSsl::Ec && ec) {
       if (deep)
            q_EC_KEY_free(ec);
       ec = nullptr;
    }
#endif
#endif // OPENSSL_NO_DEPRECATED_3_0

    if (algorithm() == QSsl::Opaque && opaque) {
        if (deep)
            q_EVP_PKEY_free(opaque);
        opaque = nullptr;
    }

    if (genericKey) {
        // None of the above cleared it. genericKey is either
        // initialised by PEM read operation, or from X509, and
        // we are the owners and not sharing. So we free it.
        q_EVP_PKEY_free(genericKey);
        genericKey = nullptr;
    }
}